

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

Real __thiscall PeleLM::getMFsum(PeleLM *this,MultiFab *a_MF,int comp)

{
  bool bVar1;
  FabType FVar2;
  anon_class_192_3_d7cc77bd *f;
  Box *box;
  FabFactory<amrex::FArrayBox> *pFVar3;
  long lVar4;
  FabArrayBase *in_RSI;
  BoxArray *in_RDI;
  Real weighted_sum;
  Array4<const_double> vfrac;
  Array4<const_amrex::EBCellFlag> *flag;
  EBCellFlagFab *flagfab;
  EBFArrayBoxFactory *ebfactory;
  Array4<double> *temp;
  Array4<const_double> *dat;
  Box *bx;
  MFIter mfi;
  MultiFab MFTemp;
  MFIter *mfi_00;
  AmrLevel *in_stack_fffffffffffff990;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff998;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff9a0;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff9a8;
  int nghost;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff9b0;
  FabArrayBase *in_stack_fffffffffffff9b8;
  DistributionMapping *in_stack_fffffffffffff9c0;
  MFIter *in_stack_fffffffffffff9f0;
  Real local_608;
  undefined1 local_600 [64];
  undefined1 auStack_5c0 [64];
  undefined1 auStack_580 [48];
  Box *in_stack_fffffffffffffab0;
  EBCellFlagFab *in_stack_fffffffffffffab8;
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 auStack_4c0 [64];
  undefined1 local_480 [64];
  Array4<const_amrex::EBCellFlag> local_440;
  Array4<const_amrex::EBCellFlag> *local_400;
  EBCellFlagFab *local_3f8;
  long local_3f0;
  undefined1 local_3e8 [64];
  undefined1 *local_3a8;
  undefined1 local_3a0 [64];
  undefined1 *local_360;
  undefined1 local_354 [148];
  MFIter local_2c0 [4];
  FabArrayBase *local_108;
  EBCellFlagFab *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  EBCellFlag *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_108 = in_RSI;
  f = (anon_class_192_3_d7cc77bd *)amrex::FabArrayBase::boxArray(in_RSI);
  box = (Box *)amrex::FabArrayBase::DistributionMap(local_108);
  local_2c0[0]._24_8_ = 0;
  local_2c0[0]._32_8_ = 0;
  local_2c0[0].fabArray = (FabArrayBase *)0x0;
  local_2c0[0].tile_size.vect[0] = 0;
  local_2c0[0].tile_size.vect[1] = 0;
  local_2c0[0].endIndex = 0;
  local_2c0[0].streams = 0;
  amrex::MFInfo::MFInfo((MFInfo *)0x299f60);
  local_2c0[0].m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  mfi_00 = local_2c0;
  amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff990);
  amrex::MultiFab::MultiFab
            ((MultiFab *)mfi_00,in_RDI,in_stack_fffffffffffff9c0,
             (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),(int)in_stack_fffffffffffff9b8,
             (MFInfo *)in_stack_fffffffffffff9b0,(FabFactory<amrex::FArrayBox> *)box);
  amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x299fbc);
  amrex::MFInfo::~MFInfo((MFInfo *)0x299fc9);
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            ((MFIter *)local_108,in_stack_fffffffffffff9b8,
             SUB81((ulong)in_stack_fffffffffffff9b0 >> 0x38,0));
  while( true ) {
    bVar1 = amrex::MFIter::isValid((MFIter *)(local_354 + 0x24));
    nghost = (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
    if (!bVar1) {
      amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff990);
      local_608 = amrex::
                  ReduceSum<amrex::FArrayBox,PeleLM::getMFsum(amrex::MultiFab&,int)::__3,void>
                            (in_stack_fffffffffffff9b0,nghost,
                             (anon_class_1_0_00000001 *)in_stack_fffffffffffff9a0);
      amrex::ParallelDescriptor::ReduceRealSum<double>(&local_608);
      amrex::MultiFab::~MultiFab((MultiFab *)0x29a5d7);
      return local_608;
    }
    amrex::MFIter::tilebox(in_stack_fffffffffffff9f0);
    local_354._28_8_ = local_354;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff9a0,(MFIter *)in_stack_fffffffffffff998,
               (int)((ulong)in_stack_fffffffffffff990 >> 0x20));
    local_360 = local_3a0;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff998,(MFIter *)in_stack_fffffffffffff990);
    local_3a8 = local_3e8;
    pFVar3 = amrex::AmrLevel::Factory(in_stack_fffffffffffff990);
    lVar4 = __dynamic_cast(pFVar3,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                           &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (lVar4 == 0) break;
    local_3f0 = lVar4;
    amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab
              ((EBFArrayBoxFactory *)in_stack_fffffffffffff990);
    local_3f8 = amrex::FabArray<amrex::EBCellFlagFab>::operator[]
                          ((FabArray<amrex::EBCellFlagFab> *)in_stack_fffffffffffff990,mfi_00);
    local_a8 = (local_3f8->super_BaseFab<amrex::EBCellFlag>).dptr;
    local_b0 = &(local_3f8->super_BaseFab<amrex::EBCellFlag>).domain;
    local_b4 = (local_3f8->super_BaseFab<amrex::EBCellFlag>).nvar;
    local_5c = 0;
    local_88 = (local_b0->smallend).vect[0];
    local_6c = 1;
    iStack_84 = (local_3f8->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
    local_d0.x = (local_b0->smallend).vect[0];
    local_d0.y = (local_b0->smallend).vect[1];
    local_7c = 2;
    local_d0.z = (local_3f8->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
    local_8 = &(local_3f8->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
    local_c = 0;
    local_38 = local_8->vect[0] + 1;
    local_18 = &(local_3f8->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
    local_1c = 1;
    iStack_34 = (local_3f8->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
    local_28 = &(local_3f8->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
    local_2c = 2;
    local_f0.z = (local_3f8->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
    local_f0.y = iStack_34;
    local_f0.x = local_38;
    local_f8 = local_3f8;
    local_dc._0_8_ = local_f0._0_8_;
    local_dc.z = local_f0.z;
    local_c0._0_8_ = local_d0._0_8_;
    local_c0.z = local_d0.z;
    local_a0._0_8_ = local_d0._0_8_;
    local_a0.z = local_d0.z;
    local_90 = local_b0;
    local_80 = local_d0.z;
    local_78 = local_b0;
    local_68 = local_b0;
    local_58 = local_b0;
    local_50._0_8_ = local_f0._0_8_;
    local_50.z = local_f0.z;
    local_40 = local_b0;
    local_30 = local_f0.z;
    amrex::Array4<const_amrex::EBCellFlag>::Array4(&local_440,local_a8,&local_c0,&local_dc,local_b4)
    ;
    local_400 = &local_440;
    FVar2 = amrex::EBCellFlagFab::getType(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    if (FVar2 == covered) {
      in_stack_fffffffffffff9b0 = (FabArray<amrex::FArrayBox> *)local_354._28_8_;
      memcpy(local_480,local_3a8,0x3c);
      amrex::ParallelFor<PeleLM::getMFsum(amrex::MultiFab&,int)::__0>
                (box,(anon_class_64_1_8991f0d2 *)f);
    }
    else {
      FVar2 = amrex::EBCellFlagFab::getType(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
      if (FVar2 == regular) {
        in_stack_fffffffffffff9a8 = (FabArray<amrex::FArrayBox> *)local_354._28_8_;
        memcpy(local_500,local_360,0x3c);
        memcpy(auStack_4c0,local_3a8,0x3c);
        amrex::ParallelFor<PeleLM::getMFsum(amrex::MultiFab&,int)::__1>
                  (box,(anon_class_128_2_e6b57da0 *)f);
      }
      else {
        amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff990);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff998,(MFIter *)in_stack_fffffffffffff990);
        in_stack_fffffffffffff9a0 = (FabArray<amrex::FArrayBox> *)local_354._28_8_;
        memcpy(local_600,local_360,0x3c);
        memcpy(auStack_5c0,local_3a8,0x3c);
        memcpy(auStack_580,local_540,0x3c);
        amrex::ParallelFor<PeleLM::getMFsum(amrex::MultiFab&,int)::__2>(box,f);
      }
    }
    amrex::MFIter::operator++((MFIter *)(local_354 + 0x24));
  }
  __cxa_bad_cast();
}

Assistant:

Real
PeleLM::getMFsum(MultiFab& a_MF,
                 int comp)
{
   AMREX_ASSERT(a_MF.nComp() >= comp);

#ifdef AMREX_USE_EB
   //
   // To get vfrac weighted sum, I need to build MF*vfrac and then do the sum
   MultiFab MFTemp(a_MF.boxArray(),a_MF.DistributionMap(),1,0);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(a_MF,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& dat = a_MF.const_array(mfi,comp);
      auto const& temp = MFTemp.array(mfi);
      auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Factory());
      auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
      auto const& flag    = flagfab.const_array();

      if (flagfab.getType(bx) == FabType::covered) {              // Covered boxes
         amrex::ParallelFor(bx, [temp]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) = 0.0;
         });
      } else if (flagfab.getType(bx) == FabType::regular ) {     // Regular boxes
         amrex::ParallelFor(bx, [dat,temp]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) = dat(i,j,k);
         });
      } else {                                                   // EB containing boxes
         auto vfrac = ebfactory.getVolFrac().const_array(mfi);
         amrex::ParallelFor(bx, [dat,temp,vfrac]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) = dat(i,j,k) * vfrac(i,j,k);
         });
      }
   }

   Real weighted_sum = amrex::ReduceSum(MFTemp, 0, []
   AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& dat ) noexcept -> Real
   {
      Real r = 0.0;
      AMREX_LOOP_3D(bx,i,j,k,
      {
         r += dat(i,j,k);
      });
      return r;
   });
   ParallelDescriptor::ReduceRealSum(weighted_sum);

   return weighted_sum;
#else
   Real sum = a_MF.sum(comp,false);
   return sum;
#endif
}